

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O3

uint8_t * get_ls_tile_buffers(AV1Decoder *pbi,uint8_t *data,uint8_t *data_end,
                             TileBufferDec (*tile_buffers) [64])

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint8_t *data_end_00;
  uint uVar4;
  _Bool _Var5;
  int iVar6;
  uint8_t *puVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  uchar *mem;
  TileBufferDec (*paTVar12) [64];
  ulong uVar13;
  ulong uVar14;
  aom_internal_error_info *error_info;
  TileBufferDec (*local_2b8) [64];
  int local_2ac;
  int local_2a8;
  uint local_2a4;
  aom_internal_error_info *local_2a0;
  uint8_t *local_298;
  int local_28c;
  long local_288;
  ulong local_280;
  long local_278;
  TileBufferDec (*local_270) [64];
  ulong local_268;
  int local_25c;
  int tile_height;
  int tile_width;
  AV1Decoder *local_250;
  TileBufferDec (*local_248) [64];
  ulong local_240;
  uint8_t *tile_col_data_end [64];
  
  uVar1 = (pbi->common).tiles.cols;
  iVar2 = (pbi->common).tiles.rows;
  if ((int)(iVar2 * uVar1) < 2) {
    (*tile_buffers)[0].data = data;
    (*tile_buffers)[0].size = (long)data_end - (long)data;
    local_2b8 = (TileBufferDec (*) [64])0x0;
  }
  else {
    local_2b8 = (TileBufferDec (*) [64])data;
    local_298 = data_end;
    local_270 = (TileBufferDec (*) [64])data;
    memset(tile_col_data_end,0,0x200);
    local_25c = pbi->dec_tile_row;
    local_2ac = iVar2;
    if (local_25c < iVar2) {
      local_2ac = local_25c;
    }
    uVar3 = pbi->dec_tile_col;
    uVar8 = uVar1;
    if ((int)uVar3 < (int)uVar1) {
      uVar8 = uVar3;
    }
    uVar4 = uVar8;
    if ((int)uVar3 < 0) {
      uVar4 = 0;
    }
    local_240 = (ulong)uVar4;
    local_28c = pbi->tile_size_bytes;
    local_2a4 = uVar8 + 1;
    if ((int)uVar3 < 0) {
      local_2a4 = uVar1;
    }
    local_278 = (long)pbi->tile_col_size_bytes;
    local_2a8 = iVar2;
    local_288 = (long)(int)uVar1;
    local_280 = (ulong)uVar1;
    _Var5 = av1_get_uniform_tile_size(&pbi->common,&tile_width,&tile_height);
    if (!_Var5) {
      aom_internal_error(&pbi->error,AOM_CODEC_CORRUPT_FRAME,
                         "Not all the tiles in the tile list have the same size.");
    }
    local_248 = tile_buffers;
    if (tile_height < tile_width) {
      tile_height = tile_width;
    }
    local_268 = CONCAT71(local_268._1_7_,tile_height * 4 < 0x101);
    if (0 < (int)local_280) {
      uVar13 = (ulong)((int)local_288 - 1);
      local_2a0 = &pbi->error;
      uVar14 = 0;
      uVar10 = local_280;
      puVar7 = local_298;
      paTVar12 = local_270;
      do {
        uVar11 = (long)puVar7 - (long)paTVar12;
        if (uVar13 == uVar14) {
          tile_col_data_end[uVar13] = puVar7;
        }
        else {
          if ((long)uVar11 < local_278) {
            aom_internal_error(local_2a0,AOM_CODEC_CORRUPT_FRAME,
                               "Not enough data to read tile_col_size");
            puVar7 = local_298;
          }
          switch((int)local_278) {
          case 1:
            uVar11 = (ulong)*(byte *)&(*paTVar12)[0].data;
            break;
          case 2:
            uVar11 = (ulong)*(ushort *)&(*paTVar12)[0].data;
            break;
          case 3:
            uVar11 = (ulong)*(uint3 *)&(*paTVar12)[0].data;
            break;
          case 4:
            uVar11 = (ulong)*(uint *)&(*paTVar12)[0].data;
            break;
          default:
            uVar11 = 0xffffffffffffffff;
          }
          paTVar12 = (TileBufferDec (*) [64])((long)&(*paTVar12)[0].data + local_278);
          if ((ulong)((long)puVar7 - (long)paTVar12) < uVar11) {
            aom_internal_error(local_2a0,AOM_CODEC_CORRUPT_FRAME,
                               "tile_col_data_end[%d] is out of bound",uVar14 & 0xffffffff);
            puVar7 = local_298;
          }
          tile_col_data_end[uVar14] = (uint8_t *)((long)&(*paTVar12)[0].data + uVar11);
          uVar10 = local_280;
        }
        paTVar12 = (TileBufferDec (*) [64])((long)&(*paTVar12)[0].data + uVar11);
        uVar14 = uVar14 + 1;
      } while (uVar10 != uVar14);
    }
    paTVar12 = local_248;
    iVar2 = local_28c;
    puVar7 = (uint8_t *)(local_268 & 0xff);
    local_2b8 = local_270;
    local_298 = puVar7;
    local_250 = pbi;
    if ((int)local_240 < (int)local_2a4) {
      local_2ac = local_2ac + 1;
      local_268 = local_288 - 1;
      uVar10 = (ulong)(int)local_240;
      if (local_25c < 0) {
        local_2ac = local_2a8;
      }
      do {
        if (0 < (long)uVar10) {
          local_2b8 = (TileBufferDec (*) [64])tile_col_data_end[uVar10 - 1];
        }
        iVar6 = local_2a8;
        if (uVar10 != local_268) {
          local_2b8 = (TileBufferDec (*) [64])((long)&(*local_2b8)[0].data + local_278);
          iVar6 = local_2ac;
        }
        if (0 < iVar6) {
          local_270 = (TileBufferDec (*) [64])tile_col_data_end[uVar10];
          iVar9 = 0;
          local_2a0 = (aom_internal_error_info *)CONCAT44(local_2a0._4_4_,iVar6);
          do {
            get_ls_tile_buffer((uint8_t *)local_270,&pbi->error,(uint8_t **)&local_2b8,paTVar12,
                               iVar2,(int)uVar10,iVar9,(int)puVar7);
            iVar9 = iVar9 + 1;
            puVar7 = local_298;
          } while ((int)local_2a0 != iVar9);
        }
        uVar10 = uVar10 + 1;
      } while (local_2a4 != (uint)uVar10);
    }
    paTVar12 = local_248;
    iVar6 = local_28c;
    iVar2 = local_2a8;
    if ((local_2a4 != (uint)local_280) && (local_2b8 = (&local_248)[local_288], 0 < local_2a8)) {
      local_2a0 = (aom_internal_error_info *)CONCAT44(local_2a0._4_4_,(uint)local_280 - 1);
      data_end_00 = tile_col_data_end[local_288 + -1];
      error_info = &local_250->error;
      iVar9 = 0;
      do {
        get_ls_tile_buffer(data_end_00,error_info,(uint8_t **)&local_2b8,paTVar12,iVar6,
                           (int)local_2a0,iVar9,(int)puVar7);
        iVar9 = iVar9 + 1;
        puVar7 = local_298;
      } while (iVar2 != iVar9);
    }
  }
  return (uint8_t *)local_2b8;
}

Assistant:

static const uint8_t *get_ls_tile_buffers(
    AV1Decoder *pbi, const uint8_t *data, const uint8_t *data_end,
    TileBufferDec (*const tile_buffers)[MAX_TILE_COLS]) {
  AV1_COMMON *const cm = &pbi->common;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  const int have_tiles = tile_cols * tile_rows > 1;
  const uint8_t *raw_data_end;  // The end of the last tile buffer

  if (!have_tiles) {
    const size_t tile_size = data_end - data;
    tile_buffers[0][0].data = data;
    tile_buffers[0][0].size = tile_size;
    raw_data_end = NULL;
  } else {
    // We locate only the tile buffers that are required, which are the ones
    // specified by pbi->dec_tile_col and pbi->dec_tile_row. Also, we always
    // need the last (bottom right) tile buffer, as we need to know where the
    // end of the compressed frame buffer is for proper superframe decoding.

    const uint8_t *tile_col_data_end[MAX_TILE_COLS] = { NULL };
    const uint8_t *const data_start = data;

    const int dec_tile_row = AOMMIN(pbi->dec_tile_row, tile_rows);
    const int single_row = pbi->dec_tile_row >= 0;
    const int tile_rows_start = single_row ? dec_tile_row : 0;
    const int tile_rows_end = single_row ? tile_rows_start + 1 : tile_rows;
    const int dec_tile_col = AOMMIN(pbi->dec_tile_col, tile_cols);
    const int single_col = pbi->dec_tile_col >= 0;
    const int tile_cols_start = single_col ? dec_tile_col : 0;
    const int tile_cols_end = single_col ? tile_cols_start + 1 : tile_cols;

    const int tile_col_size_bytes = pbi->tile_col_size_bytes;
    const int tile_size_bytes = pbi->tile_size_bytes;
    int tile_width, tile_height;
    if (!av1_get_uniform_tile_size(cm, &tile_width, &tile_height)) {
      aom_internal_error(
          &pbi->error, AOM_CODEC_CORRUPT_FRAME,
          "Not all the tiles in the tile list have the same size.");
    }
    const int tile_copy_mode =
        ((AOMMAX(tile_width, tile_height) << MI_SIZE_LOG2) <= 256) ? 1 : 0;
    // Read tile column sizes for all columns (we need the last tile buffer)
    for (int c = 0; c < tile_cols; ++c) {
      const int is_last = c == tile_cols - 1;
      size_t tile_col_size;

      if (!is_last) {
        if (tile_col_size_bytes > data_end - data) {
          aom_internal_error(&pbi->error, AOM_CODEC_CORRUPT_FRAME,
                             "Not enough data to read tile_col_size");
        }
        tile_col_size = mem_get_varsize(data, tile_col_size_bytes);
        data += tile_col_size_bytes;
        if (tile_col_size > (size_t)(data_end - data)) {
          aom_internal_error(&pbi->error, AOM_CODEC_CORRUPT_FRAME,
                             "tile_col_data_end[%d] is out of bound", c);
        }
        tile_col_data_end[c] = data + tile_col_size;
      } else {
        tile_col_size = data_end - data;
        tile_col_data_end[c] = data_end;
      }
      data += tile_col_size;
    }

    data = data_start;

    // Read the required tile sizes.
    for (int c = tile_cols_start; c < tile_cols_end; ++c) {
      const int is_last = c == tile_cols - 1;

      if (c > 0) data = tile_col_data_end[c - 1];

      if (!is_last) data += tile_col_size_bytes;

      // Get the whole of the last column, otherwise stop at the required tile.
      for (int r = 0; r < (is_last ? tile_rows : tile_rows_end); ++r) {
        get_ls_tile_buffer(tile_col_data_end[c], &pbi->error, &data,
                           tile_buffers, tile_size_bytes, c, r, tile_copy_mode);
      }
    }

    // If we have not read the last column, then read it to get the last tile.
    if (tile_cols_end != tile_cols) {
      const int c = tile_cols - 1;

      data = tile_col_data_end[c - 1];

      for (int r = 0; r < tile_rows; ++r) {
        get_ls_tile_buffer(tile_col_data_end[c], &pbi->error, &data,
                           tile_buffers, tile_size_bytes, c, r, tile_copy_mode);
      }
    }
    raw_data_end = data;
  }
  return raw_data_end;
}